

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSensorType::~IfcSensorType(IfcSensorType *this,void **vtt)

{
  void **vtt_local;
  IfcSensorType *this_local;
  
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = *vtt;
  *(void **)(&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcDistributionControlElementType).
                                super_IfcDistributionElementType.super_IfcElementType.
                                super_IfcTypeProduct.super_IfcTypeObject + -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x35];
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x37];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x148 = vtt[0x38];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x180 = vtt[0x39];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x190 = vtt[0x3a];
  *(void **)&(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             field_0x1a0 = vtt[0x3b];
  std::__cxx11::string::~string
            ((string *)&(this->super_IfcDistributionControlElementType).field_0x1b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSensorType,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSensorType,_1UL> *)
             &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              field_0x1a0,vtt + 0x32);
  IfcDistributionControlElementType::~IfcDistributionControlElementType
            (&this->super_IfcDistributionControlElementType,vtt + 1);
  return;
}

Assistant:

IfcSensorType() : Object("IfcSensorType") {}